

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

object * store_create_item(store *store,object_kind *kind)

{
  object *poVar1;
  object *carried;
  object *known_obj;
  object *obj;
  object_kind *kind_local;
  store *store_local;
  
  obj = (object *)kind;
  kind_local = (object_kind *)store;
  known_obj = object_new();
  carried = object_new();
  object_prep(known_obj,(object_kind *)obj,L'\0',RANDOMISE);
  if (known_obj->artifact == (artifact *)0x0) {
    known_obj->known = carried;
    known_obj->known->notice = known_obj->known->notice | 2;
    object_set_base_known(player,known_obj);
    known_obj->known->notice = known_obj->known->notice | 2;
    player_know_object(player,known_obj);
    known_obj->origin = '\0';
    poVar1 = store_carry((store *)kind_local,known_obj);
    if (poVar1 == (object *)0x0) {
      object_delete((chunk *)0x0,(chunk *)0x0,&carried);
      known_obj->known = (object *)0x0;
      object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
    }
    return poVar1;
  }
  __assert_fail("!obj->artifact",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x5d2,"struct object *store_create_item(struct store *, struct object_kind *)");
}

Assistant:

static struct object *store_create_item(struct store *store,
										struct object_kind *kind)
{
	struct object *obj = object_new();
	struct object *known_obj = object_new();
	struct object *carried;

	/* Create a new object of the chosen kind */
	object_prep(obj, kind, 0, RANDOMISE);
	assert(!obj->artifact);

	/* Know everything the player knows, no origin yet */
	obj->known = known_obj;
	obj->known->notice |= OBJ_NOTICE_ASSESSED;
	object_set_base_known(player, obj);
	obj->known->notice |= OBJ_NOTICE_ASSESSED;
	player_know_object(player, obj);
	obj->origin = ORIGIN_NONE;

	/* Attempt to carry the object */
	carried = store_carry(store, obj);
	if (!carried) {
		object_delete(NULL, NULL, &known_obj);
		obj->known = NULL;
		object_delete(NULL, NULL, &obj);
	}
	return carried;
}